

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O1

void autotest2(void)

{
  int iVar1;
  double *xpred;
  double *amse;
  FILE *__stream;
  double *inp;
  auto_arima_object obj;
  int iVar2;
  undefined1 *puVar3;
  long lVar4;
  double dVar5;
  undefined1 local_25d8 [8];
  double temp [1200];
  int local_50 [2];
  int order [3];
  int seasonal [3];
  
  local_50[0] = 5;
  local_50[1] = 2;
  order[0] = 5;
  order[1] = 2;
  order[2] = 1;
  xpred = (double *)malloc(0x28);
  amse = (double *)malloc(0x28);
  __stream = fopen("../data/wineind.txt","r");
  if (__stream != (FILE *)0x0) {
    iVar1 = feof(__stream);
    iVar2 = 0;
    if (iVar1 == 0) {
      puVar3 = local_25d8;
      iVar2 = 0;
      do {
        __isoc99_fscanf(__stream,"%lf\n",puVar3);
        iVar1 = feof(__stream);
        puVar3 = puVar3 + 8;
        iVar2 = iVar2 + 1;
      } while (iVar1 == 0);
    }
    inp = (double *)malloc((long)iVar2 * 8 - 0x28);
    if (5 < iVar2) {
      memcpy(inp,local_25d8,(ulong)(iVar2 - 5U) << 3);
    }
    lVar4 = 0;
    obj = auto_arima_init(local_50,order + 1,0xc,0,iVar2 - 5U);
    auto_arima_setApproximation(obj,0);
    auto_arima_setStepwise(obj,0);
    auto_arima_exec(obj,inp,(double *)0x0);
    auto_arima_summary(obj);
    auto_arima_predict(obj,inp,(double *)0x0,5,(double *)0x0,xpred,amse);
    putchar(10);
    printf("Predicted Values : ");
    do {
      printf("%g ",xpred[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
    putchar(10);
    lVar4 = 0;
    printf("Standard Errors  : ");
    do {
      dVar5 = amse[lVar4];
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      printf("%g ",dVar5);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 5);
    putchar(10);
    auto_arima_free(obj);
    free(inp);
    free(xpred);
    free(amse);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void autotest2() {
	int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	double *xpred, *amse,*xreg,*newxreg;
	auto_arima_object obj;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 5;
	d = 2;
	q = 5;
	s = 12;
	P = 2;
	D = 1;
	Q = 2;
	r = 0;
	int order[3] = {p,d,q};
	int seasonal[3] = {P,D,Q};


	L = 5;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/wineind.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf\n", &temp[i]);
		i++;
	}
	N = i - L;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * 2);
    newxreg = (double*)malloc(sizeof(double)* L * 2);


	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        //xreg[i] = temp1[i];
		//xreg[N+i] = temp2[i];
	}

    for(i = 0; i < L;++i) {
        //newxreg[i] = temp1[N + i];
        //newxreg[i+L] = temp2[N + i];
    }

	obj = auto_arima_init(order,seasonal,s,r,N);

	auto_arima_setApproximation(obj,0);
	auto_arima_setStepwise(obj,0);

	auto_arima_exec(obj,inp,NULL);

	auto_arima_summary(obj);

	auto_arima_predict(obj, inp, NULL, L,NULL, xpred, amse);

	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");

	auto_arima_free(obj);

	
	free(inp);
	free(xpred);
	free(amse);
    free(xreg);
    free(newxreg);
}